

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

void ssl_mac(mbedtls_md_context_t *md_ctx,uchar *secret,uchar *buf,size_t len,uchar *ctr,int type)

{
  byte bVar1;
  uint uVar2;
  mbedtls_md_type_t mVar3;
  int md_type;
  int md_size;
  int padlen;
  uchar padding [48];
  undefined8 local_3f;
  uchar header [11];
  int type_local;
  uchar *ctr_local;
  size_t len_local;
  uchar *buf_local;
  uchar *secret_local;
  mbedtls_md_context_t *md_ctx_local;
  
  header._3_4_ = type;
  unique0x10000157 = ctr;
  bVar1 = mbedtls_md_get_size(md_ctx->md_info);
  uVar2 = (uint)bVar1;
  mVar3 = mbedtls_md_get_type(md_ctx->md_info);
  if (mVar3 == MBEDTLS_MD_MD5) {
    md_type = 0x30;
  }
  else {
    md_type = 0x28;
  }
  local_3f = *(undefined8 *)stack0xffffffffffffffd0;
  header[0] = (uchar)header._3_4_;
  header[1] = (uchar)(len >> 8);
  header[2] = (uchar)len;
  memset(&md_size,0x36,(long)md_type);
  mbedtls_md_starts(md_ctx);
  mbedtls_md_update(md_ctx,secret,(long)(int)uVar2);
  mbedtls_md_update(md_ctx,(uchar *)&md_size,(long)md_type);
  mbedtls_md_update(md_ctx,(uchar *)&local_3f,0xb);
  mbedtls_md_update(md_ctx,buf,len);
  mbedtls_md_finish(md_ctx,buf + len);
  memset(&md_size,0x5c,(long)md_type);
  mbedtls_md_starts(md_ctx);
  mbedtls_md_update(md_ctx,secret,(long)(int)uVar2);
  mbedtls_md_update(md_ctx,(uchar *)&md_size,(long)md_type);
  mbedtls_md_update(md_ctx,buf + len,(long)(int)uVar2);
  mbedtls_md_finish(md_ctx,buf + len);
  return;
}

Assistant:

static void ssl_mac( mbedtls_md_context_t *md_ctx, unsigned char *secret,
                     unsigned char *buf, size_t len,
                     unsigned char *ctr, int type )
{
    unsigned char header[11];
    unsigned char padding[48];
    int padlen;
    int md_size = mbedtls_md_get_size( md_ctx->md_info );
    int md_type = mbedtls_md_get_type( md_ctx->md_info );

    /* Only MD5 and SHA-1 supported */
    if( md_type == MBEDTLS_MD_MD5 )
        padlen = 48;
    else
        padlen = 40;

    memcpy( header, ctr, 8 );
    header[ 8] = (unsigned char)  type;
    header[ 9] = (unsigned char)( len >> 8 );
    header[10] = (unsigned char)( len      );

    memset( padding, 0x36, padlen );
    mbedtls_md_starts( md_ctx );
    mbedtls_md_update( md_ctx, secret,  md_size );
    mbedtls_md_update( md_ctx, padding, padlen  );
    mbedtls_md_update( md_ctx, header,  11      );
    mbedtls_md_update( md_ctx, buf,     len     );
    mbedtls_md_finish( md_ctx, buf +    len     );

    memset( padding, 0x5C, padlen );
    mbedtls_md_starts( md_ctx );
    mbedtls_md_update( md_ctx, secret,    md_size );
    mbedtls_md_update( md_ctx, padding,   padlen  );
    mbedtls_md_update( md_ctx, buf + len, md_size );
    mbedtls_md_finish( md_ctx, buf + len          );
}